

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

void opj_jp2_free_pclr(opj_jp2_color_t *color)

{
  opj_jp2_pclr_t *ptr;
  
  opj_free(color->jp2_pclr->channel_sign);
  opj_free(color->jp2_pclr->channel_size);
  opj_free(color->jp2_pclr->entries);
  ptr = color->jp2_pclr;
  if (ptr->cmap != (opj_jp2_cmap_comp_t *)0x0) {
    opj_free(ptr->cmap);
    ptr = color->jp2_pclr;
  }
  opj_free(ptr);
  color->jp2_pclr = (opj_jp2_pclr_t *)0x0;
  return;
}

Assistant:

static void opj_jp2_free_pclr(opj_jp2_color_t *color)
{
    opj_free(color->jp2_pclr->channel_sign);
    opj_free(color->jp2_pclr->channel_size);
    opj_free(color->jp2_pclr->entries);

    if (color->jp2_pclr->cmap) {
        opj_free(color->jp2_pclr->cmap);
    }

    opj_free(color->jp2_pclr);
    color->jp2_pclr = NULL;
}